

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O1

void impossible(char *s,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list the_args;
  char pbuf [256];
  __va_list_tag local_1f8;
  undefined1 local_1d8 [8];
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  char local_128 [264];
  
  local_1f8.reg_save_area = local_1d8;
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  local_1f8.overflow_arg_area = &the_args[0].overflow_arg_area;
  local_1f8.gp_offset = 8;
  local_1f8.fp_offset = 0x30;
  local_1d0 = in_RSI;
  local_1c8 = in_RDX;
  local_1c0 = in_RCX;
  local_1b8 = in_R8;
  local_1b0 = in_R9;
  if (program_state.in_impossible != 0) {
    panic("impossible called impossible");
  }
  program_state.in_impossible = 1;
  vsprintf(local_128,s,&local_1f8);
  paniclog("impossible",local_128);
  vpline(s,&local_1f8);
  pline("Program in disorder - perhaps you\'d better save.");
  program_state.in_impossible = 0;
  return;
}

Assistant:

void impossible (const char *s, ...)
{
	va_list the_args;
	va_start(the_args, s);
	if (program_state.in_impossible)
		panic("impossible called impossible");
	program_state.in_impossible = 1;
	{
	    char pbuf[BUFSZ];
	    vsprintf(pbuf,s,the_args);
	    paniclog("impossible", pbuf);
	}
	vpline(s,the_args);
	pline("Program in disorder - perhaps you'd better save.");
	program_state.in_impossible = 0;
	va_end(the_args);
}